

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O2

void __thiscall net_peer_eviction_tests::peer_eviction_test::test_method(peer_eviction_test *this)

{
  long lVar1;
  function<void_(NodeEvictionCandidate_&)> candidate_setup_fn;
  function<void_(NodeEvictionCandidate_&)> candidate_setup_fn_00;
  function<void_(NodeEvictionCandidate_&)> candidate_setup_fn_01;
  function<void_(NodeEvictionCandidate_&)> candidate_setup_fn_02;
  function<void_(NodeEvictionCandidate_&)> candidate_setup_fn_03;
  function<void_(NodeEvictionCandidate_&)> candidate_setup_fn_04;
  function<void_(NodeEvictionCandidate_&)> candidate_setup_fn_05;
  bool bVar2;
  long lVar3;
  uint number_of_nodes;
  undefined8 *puVar4;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  byte bVar8;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  optional<long> oVar9;
  undefined1 *puVar10;
  check_type cVar11;
  char *in_stack_fffffffffffffb78;
  _Invoker_type in_stack_fffffffffffffb80;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  _Any_data local_418;
  code *local_408;
  code *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  _Any_data local_288;
  code *local_278;
  code *local_270;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  char **local_208;
  undefined1 local_1fb [2];
  undefined1 local_1f9;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  assertion_result local_1d0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 local_198 [16];
  __node_base local_188;
  char **ppcStack_180;
  _Prime_rehash_policy local_178;
  __node_base_ptr local_168;
  uint32_t auStack_160 [2];
  undefined1 local_158 [32];
  undefined1 local_138 [64];
  undefined1 local_f8 [16];
  shared_count local_e8;
  uint32_t auStack_e0 [2];
  undefined1 local_d8 [24];
  FastRandomContext random_context;
  
  bVar8 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&random_context,true);
  number_of_nodes = 0;
  do {
    if (number_of_nodes == 200) {
      ChaCha20::~ChaCha20(&random_context.rng);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_1a0 = "";
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x25e;
    file.m_begin = (iterator)&local_1a8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b8,msg);
    local_1f8._8_8_ = 0;
    local_1f8._4_4_ = 0;
    local_1f8._0_4_ = number_of_nodes;
    local_1e0 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:602:9)>
                ::_M_invoke;
    local_1e8 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:602:9)>
                ::_M_manager;
    local_e8.pi_ = (sp_counted_base *)0x2;
    auStack_e0[0] = 3;
    auStack_e0[1] = 0;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    local_f8._8_8_ = 1;
    puVar10 = local_1fb;
    std::
    _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<long_const*>
              ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_198,local_f8,local_d8,0,&local_1f9);
    candidate_setup_fn.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
    candidate_setup_fn.super__Function_base._M_functor._M_unused._M_object = puVar10;
    candidate_setup_fn.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb78;
    candidate_setup_fn._M_invoker = in_stack_fffffffffffffb80;
    bVar2 = IsEvicted(number_of_nodes,candidate_setup_fn,
                      (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&local_1f8,(FastRandomContext *)local_198);
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = 
    "!IsEvicted( number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) { candidate.nKeyedNetGroup = number_of_nodes - candidate.id; }, {0, 1, 2, 3}, random_context)"
    ;
    local_228 = "";
    local_220[8] = false;
    local_220._0_8_ = &PTR__lazy_ostream_011481f0;
    local_210 = boost::unit_test::lazy_ostream::inst;
    local_208 = &local_230;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_238 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar2;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,(lazy_ostream *)local_220,1,0,WARN,_cVar11,(size_t)&local_240,0x25e);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_198);
    std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_248 = "";
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x266;
    file_00.m_begin = (iterator)&local_250;
    msg_00.m_end = pvVar7;
    msg_00.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_260,
               msg_00);
    local_288._M_unused._M_object = (void *)0x0;
    local_288._8_8_ = 0;
    local_270 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:610:9)>
                ::_M_invoke;
    local_278 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:610:9)>
                ::_M_manager;
    local_168 = (__node_base_ptr)0x6;
    auStack_160[0] = 7;
    auStack_160[1] = 0;
    local_178._M_max_load_factor = 5.60519e-45;
    local_178._4_4_ = 0;
    local_178._M_next_resize = 5;
    local_188._M_nxt = (_Hash_node_base *)0x2;
    ppcStack_180 = (char **)0x3;
    local_198._0_8_ = (__buckets_ptr)0x0;
    local_198._8_4_ = 1;
    local_198._12_4_ = 0;
    puVar10 = local_1fb;
    std::
    _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<long_const*>
              ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_f8,
               (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_198,local_158,0,&local_1f9);
    candidate_setup_fn_00.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
    candidate_setup_fn_00.super__Function_base._M_functor._M_unused._M_object = puVar10;
    candidate_setup_fn_00.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb78
    ;
    candidate_setup_fn_00._M_invoker = in_stack_fffffffffffffb80;
    bVar2 = IsEvicted(number_of_nodes,candidate_setup_fn_00,
                      (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&local_288,(FastRandomContext *)local_f8);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = 
    "!IsEvicted( number_of_nodes, [](NodeEvictionCandidate& candidate) { candidate.m_min_ping_time = std::chrono::microseconds{candidate.id}; }, {0, 1, 2, 3, 4, 5, 6, 7}, random_context)"
    ;
    local_228 = "";
    local_220[8] = false;
    local_220._0_8_ = &PTR__lazy_ostream_011481f0;
    local_210 = boost::unit_test::lazy_ostream::inst;
    local_208 = &local_230;
    local_298 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_290 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,(lazy_ostream *)local_220,1,0,WARN,_cVar11,(size_t)&local_298,0x266);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_288);
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_2a0 = "";
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x26e;
    file_01.m_begin = (iterator)&local_2a8;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2b8,
               msg_01);
    local_2d8._8_8_ = 0;
    local_2d8._4_4_ = 0;
    local_2d8._0_4_ = number_of_nodes;
    local_2c0 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:618:9)>
                ::_M_invoke;
    local_2c8 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:618:9)>
                ::_M_manager;
    local_e8.pi_ = (sp_counted_base *)0x2;
    auStack_e0[0] = 3;
    auStack_e0[1] = 0;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    local_f8._8_8_ = 1;
    puVar10 = local_1fb;
    std::
    _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<long_const*>
              ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_198,(FastRandomContext *)local_f8,local_d8,0,&local_1f9);
    candidate_setup_fn_01.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
    candidate_setup_fn_01.super__Function_base._M_functor._M_unused._M_object = puVar10;
    candidate_setup_fn_01.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb78
    ;
    candidate_setup_fn_01._M_invoker = in_stack_fffffffffffffb80;
    bVar2 = IsEvicted(number_of_nodes,candidate_setup_fn_01,
                      (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&local_2d8,(FastRandomContext *)local_198);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = 
    "!IsEvicted( number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) { candidate.m_last_tx_time = std::chrono::seconds{number_of_nodes - candidate.id}; }, {0, 1, 2, 3}, random_context)"
    ;
    local_228 = "";
    local_220[8] = false;
    local_220._0_8_ = &PTR__lazy_ostream_011481f0;
    local_210 = boost::unit_test::lazy_ostream::inst;
    local_208 = &local_230;
    local_2e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_2e0 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,(lazy_ostream *)local_220,1,0,WARN,_cVar11,(size_t)&local_2e8,0x26e);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_198);
    std::_Function_base::~_Function_base((_Function_base *)&local_2d8);
    local_2f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_2f0 = "";
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x27a;
    file_02.m_begin = (iterator)&local_2f8;
    msg_02.m_end = pvVar7;
    msg_02.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_308,
               msg_02);
    local_328._8_8_ = 0;
    local_328._4_4_ = 0;
    local_328._0_4_ = number_of_nodes;
    local_310 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:626:9)>
                ::_M_invoke;
    local_318 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:626:9)>
                ::_M_manager;
    local_168 = (__node_base_ptr)0x6;
    auStack_160[0] = 7;
    auStack_160[1] = 0;
    local_178._M_max_load_factor = 5.60519e-45;
    local_178._4_4_ = 0;
    local_178._M_next_resize = 5;
    local_188._M_nxt = (_Hash_node_base *)0x2;
    ppcStack_180 = (char **)0x3;
    local_198._0_8_ = (__buckets_ptr)0x0;
    local_198._8_4_ = 1;
    local_198._12_4_ = 0;
    puVar10 = local_1fb;
    std::
    _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<long_const*>
              ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_f8,
               (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_198,local_158,0,&local_1f9);
    candidate_setup_fn_02.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
    candidate_setup_fn_02.super__Function_base._M_functor._M_unused._M_object = puVar10;
    candidate_setup_fn_02.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb78
    ;
    candidate_setup_fn_02._M_invoker = in_stack_fffffffffffffb80;
    bVar2 = IsEvicted(number_of_nodes,candidate_setup_fn_02,
                      (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&local_328,(FastRandomContext *)local_f8);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = 
    "!IsEvicted( number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) { candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id}; if (candidate.id <= 7) { candidate.m_relay_txs = false; candidate.fRelevantServices = true; } }, {0, 1, 2, 3, 4, 5, 6, 7}, random_context)"
    ;
    local_228 = "";
    local_220[8] = false;
    local_220._0_8_ = &PTR__lazy_ostream_011481f0;
    local_210 = boost::unit_test::lazy_ostream::inst;
    local_208 = &local_230;
    local_338 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_330 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,(lazy_ostream *)local_220,1,0,WARN,_cVar11,(size_t)&local_338,0x27a);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_328);
    local_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_340 = "";
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x282;
    file_03.m_begin = (iterator)&local_348;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_358,
               msg_03);
    local_378._8_8_ = 0;
    local_378._4_4_ = 0;
    local_378._0_4_ = number_of_nodes;
    local_360 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:638:9)>
                ::_M_invoke;
    local_368 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:638:9)>
                ::_M_manager;
    local_e8.pi_ = (sp_counted_base *)0x2;
    auStack_e0[0] = 3;
    auStack_e0[1] = 0;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    local_f8._8_8_ = 1;
    puVar10 = local_1fb;
    std::
    _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<long_const*>
              ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_198,(FastRandomContext *)local_f8,local_d8,0,&local_1f9);
    candidate_setup_fn_03.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
    candidate_setup_fn_03.super__Function_base._M_functor._M_unused._M_object = puVar10;
    candidate_setup_fn_03.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb78
    ;
    candidate_setup_fn_03._M_invoker = in_stack_fffffffffffffb80;
    bVar2 = IsEvicted(number_of_nodes,candidate_setup_fn_03,
                      (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&local_378,(FastRandomContext *)local_198);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = 
    "!IsEvicted( number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) { candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id}; }, {0, 1, 2, 3}, random_context)"
    ;
    local_228 = "";
    local_220[8] = false;
    local_220._0_8_ = &PTR__lazy_ostream_011481f0;
    local_210 = boost::unit_test::lazy_ostream::inst;
    local_208 = &local_230;
    local_388 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_380 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,(lazy_ostream *)local_220,1,0,WARN,_cVar11,(size_t)&local_388,0x282);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_198);
    std::_Function_base::~_Function_base((_Function_base *)&local_378);
    local_398 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_390 = "";
    local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x28d;
    file_04.m_begin = (iterator)&local_398;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3a8,
               msg_04);
    local_3c8._8_8_ = 0;
    local_3c8._4_4_ = 0;
    local_3c8._0_4_ = number_of_nodes;
    local_3b0 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:645:9)>
                ::_M_invoke;
    local_3b8 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:645:9)>
                ::_M_manager;
    puVar4 = &DAT_00bc2e38;
    p_Var5 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_198;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      p_Var5->_M_buckets = (__buckets_ptr)*puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      p_Var5 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)((long)p_Var5 + (ulong)bVar8 * -0x10 + 8);
    }
    puVar10 = local_1fb;
    std::
    _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<long_const*>
              ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_f8,
               (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_198,local_138,0,&local_1f9);
    candidate_setup_fn_04.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
    candidate_setup_fn_04.super__Function_base._M_functor._M_unused._M_object = puVar10;
    candidate_setup_fn_04.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb78
    ;
    candidate_setup_fn_04._M_invoker = in_stack_fffffffffffffb80;
    bVar2 = IsEvicted(number_of_nodes,candidate_setup_fn_04,
                      (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&local_3c8,(FastRandomContext *)local_f8);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = 
    "!IsEvicted( number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) { candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id}; if (candidate.id <= 7) { candidate.m_relay_txs = false; candidate.fRelevantServices = true; } }, {0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11}, random_context)"
    ;
    local_228 = "";
    local_220[8] = false;
    local_220._0_8_ = &PTR__lazy_ostream_011481f0;
    local_210 = boost::unit_test::lazy_ostream::inst;
    local_208 = &local_230;
    local_3d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_3d0 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,(lazy_ostream *)local_220,1,0,WARN,_cVar11,(size_t)&local_3d8,0x28d);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_3c8);
    local_3e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_3e0 = "";
    local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x297;
    file_05.m_begin = (iterator)&local_3e8;
    msg_05.m_end = pvVar7;
    msg_05.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3f8,
               msg_05);
    local_418._8_8_ = 0;
    local_418._4_4_ = 0;
    local_418._0_4_ = number_of_nodes;
    local_400 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:656:9)>
                ::_M_invoke;
    local_408 = std::
                _Function_handler<void_(NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp:656:9)>
                ::_M_manager;
    memcpy((lazy_ostream *)local_198,&DAT_00bc2e98,0xa0);
    puVar10 = local_1fb;
    std::
    _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<long_const*>
              ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_f8,(lazy_ostream *)local_198,local_f8,0,&local_1f9);
    candidate_setup_fn_05.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
    candidate_setup_fn_05.super__Function_base._M_functor._M_unused._M_object = puVar10;
    candidate_setup_fn_05.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb78
    ;
    candidate_setup_fn_05._M_invoker = in_stack_fffffffffffffb80;
    bVar2 = IsEvicted(number_of_nodes,candidate_setup_fn_05,
                      (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&local_418,(FastRandomContext *)local_f8);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar2;
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_230 = 
    "!IsEvicted( number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) { candidate.nKeyedNetGroup = number_of_nodes - candidate.id; candidate.m_min_ping_time = std::chrono::microseconds{candidate.id}; candidate.m_last_tx_time = std::chrono::seconds{number_of_nodes - candidate.id}; candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id}; }, {0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19}, random_context)"
    ;
    local_228 = "";
    local_220[8] = false;
    local_220._0_8_ = &PTR__lazy_ostream_011481f0;
    local_210 = boost::unit_test::lazy_ostream::inst;
    local_208 = &local_230;
    local_428 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_420 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,(lazy_ostream *)local_220,1,0,WARN,_cVar11,(size_t)&local_428,0x297);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_418);
    if (number_of_nodes < 0x1d) {
      if (number_of_nodes < 0x15) {
        local_468 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
        ;
        local_460 = "";
        local_478 = &boost::unit_test::basic_cstring<char_const>::null;
        local_470 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x2a4;
        file_07.m_begin = (iterator)&local_468;
        msg_07.m_end = in_R9;
        msg_07.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_478
                   ,msg_07);
        GetRandomNodeEvictionCandidates
                  ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
                   local_220,number_of_nodes,&random_context);
        oVar9 = SelectNodeToEvict((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                                   *)local_220);
        local_f8._0_4_ =
             CONCAT31(local_f8._1_3_,
                      ~oVar9.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_engaged) & 0xffffff01;
        local_f8._8_8_ = 0;
        local_e8.pi_ = (sp_counted_base *)0x0;
        local_1d0._0_8_ =
             "!SelectNodeToEvict(GetRandomNodeEvictionCandidates(number_of_nodes, random_context))";
        local_1d0.m_message.px = (element_type *)0xbc24a2;
        local_198._8_4_ = local_198._8_4_ & 0xffffff00;
        local_198._0_8_ = &PTR__lazy_ostream_011481f0;
        local_188._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
        ppcStack_180 = (char **)&local_1d0;
        in_stack_fffffffffffffb78 =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
        ;
        in_stack_fffffffffffffb80 = (_Invoker_type)0xbbf941;
        in_R8 = &DAT_00000001;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_f8,(lazy_ostream *)local_198,1,0,WARN,_cVar11,
                   (size_t)&stack0xfffffffffffffb78,0x2a4);
        goto LAB_003e19d0;
      }
    }
    else {
      local_438 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
      ;
      local_430 = "";
      local_448 = &boost::unit_test::basic_cstring<char_const>::null;
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x29d;
      file_06.m_begin = (iterator)&local_438;
      msg_06.m_end = in_R9;
      msg_06.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_448,
                 msg_06);
      GetRandomNodeEvictionCandidates
                ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)local_220,
                 number_of_nodes,&random_context);
      oVar9 = SelectNodeToEvict((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                                 *)local_220);
      local_f8[0] = oVar9.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_engaged;
      local_f8._8_8_ = 0;
      local_e8.pi_ = (sp_counted_base *)0x0;
      local_1d0._0_8_ =
           "SelectNodeToEvict(GetRandomNodeEvictionCandidates(number_of_nodes, random_context))";
      local_1d0.m_message.px = (element_type *)0xbc24a2;
      local_198._8_4_ = local_198._8_4_ & 0xffffff00;
      local_198._0_8_ = &PTR__lazy_ostream_011481f0;
      local_188._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
      ppcStack_180 = (char **)&local_1d0;
      local_458 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
      ;
      local_450 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_f8,(lazy_ostream *)local_198,1,0,WARN,_cVar11,
                 (size_t)&local_458,0x29d);
LAB_003e19d0:
      boost::detail::shared_count::~shared_count(&local_e8);
      std::_Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::
      ~_Vector_base((_Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
                    local_220);
    }
    number_of_nodes = number_of_nodes + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(peer_eviction_test)
{
    FastRandomContext random_context{true};

    for (int number_of_nodes = 0; number_of_nodes < 200; ++number_of_nodes) {
        // Four nodes with the highest keyed netgroup values should be
        // protected from eviction.
        BOOST_CHECK(!IsEvicted(
                        number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) {
                            candidate.nKeyedNetGroup = number_of_nodes - candidate.id;
                        },
                        {0, 1, 2, 3}, random_context));

        // Eight nodes with the lowest minimum ping time should be protected
        // from eviction.
        BOOST_CHECK(!IsEvicted(
                        number_of_nodes, [](NodeEvictionCandidate& candidate) {
                            candidate.m_min_ping_time = std::chrono::microseconds{candidate.id};
                        },
                        {0, 1, 2, 3, 4, 5, 6, 7}, random_context));

        // Four nodes that most recently sent us novel transactions accepted
        // into our mempool should be protected from eviction.
        BOOST_CHECK(!IsEvicted(
                        number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) {
                            candidate.m_last_tx_time = std::chrono::seconds{number_of_nodes - candidate.id};
                        },
                        {0, 1, 2, 3}, random_context));

        // Up to eight non-tx-relay peers that most recently sent us novel
        // blocks should be protected from eviction.
        BOOST_CHECK(!IsEvicted(
                        number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) {
                            candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id};
                            if (candidate.id <= 7) {
                                candidate.m_relay_txs = false;
                                candidate.fRelevantServices = true;
                            }
                        },
                        {0, 1, 2, 3, 4, 5, 6, 7}, random_context));

        // Four peers that most recently sent us novel blocks should be
        // protected from eviction.
        BOOST_CHECK(!IsEvicted(
                        number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) {
                            candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id};
                        },
                        {0, 1, 2, 3}, random_context));

        // Combination of the previous two tests.
        BOOST_CHECK(!IsEvicted(
                        number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) {
                            candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id};
                            if (candidate.id <= 7) {
                                candidate.m_relay_txs = false;
                                candidate.fRelevantServices = true;
                            }
                        },
                        {0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11}, random_context));

        // Combination of all tests above.
        BOOST_CHECK(!IsEvicted(
                        number_of_nodes, [number_of_nodes](NodeEvictionCandidate& candidate) {
                            candidate.nKeyedNetGroup = number_of_nodes - candidate.id;           // 4 protected
                            candidate.m_min_ping_time = std::chrono::microseconds{candidate.id}; // 8 protected
                            candidate.m_last_tx_time = std::chrono::seconds{number_of_nodes - candidate.id};    // 4 protected
                            candidate.m_last_block_time = std::chrono::seconds{number_of_nodes - candidate.id}; // 4 protected
                        },
                        {0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19}, random_context));

        // An eviction is expected given >= 29 random eviction candidates. The eviction logic protects at most
        // four peers by net group, eight by lowest ping time, four by last time of novel tx, up to eight non-tx-relay
        // peers by last novel block time, and four more peers by last novel block time.
        if (number_of_nodes >= 29) {
            BOOST_CHECK(SelectNodeToEvict(GetRandomNodeEvictionCandidates(number_of_nodes, random_context)));
        }

        // No eviction is expected given <= 20 random eviction candidates. The eviction logic protects at least
        // four peers by net group, eight by lowest ping time, four by last time of novel tx and four peers by last
        // novel block time.
        if (number_of_nodes <= 20) {
            BOOST_CHECK(!SelectNodeToEvict(GetRandomNodeEvictionCandidates(number_of_nodes, random_context)));
        }

        // Cases left to test:
        // * "If any remaining peers are preferred for eviction consider only them. [...]"
        // * "Identify the network group with the most connections and youngest member. [...]"
    }
}